

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O2

void btSoftRigidDynamicsWorld::rayTestSingle
               (btTransform *rayFromTrans,btTransform *rayToTrans,btCollisionObject *collisionObject
               ,btCollisionShape *collisionShape,btTransform *colObjWorldTransform,
               RayResultCallback *resultCallback)

{
  btScalar (*pabVar1) [4];
  ulong uVar2;
  btVector3 bVar3;
  bool bVar4;
  btVector3 bVar5;
  btVector3 local_98;
  LocalShapeInfo shapeInfo;
  sRayCast softResult;
  float local_68;
  float fStack_64;
  LocalRayResult rayResult;
  
  if (collisionShape->m_shapeType == 0x20) {
    if ((collisionObject != (btCollisionObject *)0x0) && (collisionObject->m_internalType == 8)) {
      bVar4 = btSoftBody::rayTest((btSoftBody *)collisionObject,&rayFromTrans->m_origin,
                                  &rayToTrans->m_origin,&softResult);
      if ((bVar4) && (softResult.fraction <= resultCallback->m_closestHitFraction)) {
        shapeInfo.m_shapePart = 0;
        shapeInfo.m_triangleIndex = softResult.index;
        bVar5 = operator-(&rayToTrans->m_origin,&rayFromTrans->m_origin);
        uVar2 = bVar5.m_floats._0_8_ ^ 0x8000000080000000;
        local_98.m_floats[2] = -bVar5.m_floats[2];
        local_98.m_floats[0] = (btScalar)(int)uVar2;
        local_98.m_floats[1] = (btScalar)(int)(uVar2 >> 0x20);
        local_98.m_floats[3] = 0.0;
        btVector3::normalize(&local_98);
        bVar3.m_floats = local_98.m_floats;
        if (softResult.feature == Face) {
          pabVar1 = (btScalar (*) [4])
                    (*(long *)&collisionObject[2].m_checkCollideWith + 0x28 +
                    (long)softResult.index * 0x48);
          uVar2 = *(ulong *)*pabVar1;
          local_68 = bVar5.m_floats[0];
          fStack_64 = bVar5.m_floats[1];
          local_98.m_floats[2] = (btScalar)*(undefined8 *)(*pabVar1 + 2);
          bVar3.m_floats = *pabVar1;
          if (0.0 < bVar5.m_floats[2] * local_98.m_floats[2] +
                    local_68 * (float)uVar2 + fStack_64 * (float)(uVar2 >> 0x20)) {
            bVar3.m_floats[2] = -local_98.m_floats[2];
            bVar3.m_floats[0] = (btScalar)(int)(uVar2 ^ 0x8000000080000000);
            bVar3.m_floats[1] = (btScalar)(int)((uVar2 ^ 0x8000000080000000) >> 0x20);
            bVar3.m_floats[3] = 0.0;
          }
        }
        local_98.m_floats = bVar3.m_floats;
        rayResult.m_localShapeInfo = &shapeInfo;
        rayResult.m_hitNormalLocal.m_floats[0] = local_98.m_floats[0];
        rayResult.m_hitNormalLocal.m_floats[1] = local_98.m_floats[1];
        rayResult.m_hitNormalLocal.m_floats[2] = local_98.m_floats[2];
        rayResult.m_hitNormalLocal.m_floats[3] = local_98.m_floats[3];
        rayResult.m_hitFraction = softResult.fraction;
        rayResult.m_collisionObject = collisionObject;
        (*resultCallback->_vptr_RayResultCallback[3])(resultCallback,&rayResult,1);
      }
    }
    return;
  }
  btCollisionWorld::rayTestSingle
            (rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,
             resultCallback);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::rayTestSingle(const btTransform& rayFromTrans,const btTransform& rayToTrans,
					  btCollisionObject* collisionObject,
					  const btCollisionShape* collisionShape,
					  const btTransform& colObjWorldTransform,
					  RayResultCallback& resultCallback)
{
	if (collisionShape->isSoftBody()) {
		btSoftBody* softBody = btSoftBody::upcast(collisionObject);
		if (softBody) {
			btSoftBody::sRayCast softResult;
			if (softBody->rayTest(rayFromTrans.getOrigin(), rayToTrans.getOrigin(), softResult)) 
			{
				
				if (softResult.fraction<= resultCallback.m_closestHitFraction)
				{

					btCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = 0;
					shapeInfo.m_triangleIndex = softResult.index;
					// get the normal
					btVector3 rayDir = rayToTrans.getOrigin() - rayFromTrans.getOrigin();
					btVector3 normal=-rayDir;
					normal.normalize();

					if (softResult.feature == btSoftBody::eFeature::Face)
					{
						normal = softBody->m_faces[softResult.index].m_normal;
						if (normal.dot(rayDir) > 0) {
							// normal always point toward origin of the ray
							normal = -normal;
						}
					}
	
					btCollisionWorld::LocalRayResult rayResult
						(collisionObject,
						 &shapeInfo,
						 normal,
						 softResult.fraction);
					bool	normalInWorldSpace = true;
					resultCallback.addSingleResult(rayResult,normalInWorldSpace);
				}
			}
		}
	} 
	else {
		btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,resultCallback);
	}
}